

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkPipelineRenderingCreateInfo * __thiscall
Fossilize::StateRecorder::Impl::copy<VkPipelineRenderingCreateInfo>
          (Impl *this,VkPipelineRenderingCreateInfo *src,size_t count,ScratchAllocator *alloc)

{
  VkPipelineRenderingCreateInfo *pVVar1;
  
  if (count != 0) {
    pVVar1 = ScratchAllocator::allocate_n<VkPipelineRenderingCreateInfo>(alloc,count);
    if (pVVar1 != (VkPipelineRenderingCreateInfo *)0x0) {
      pVVar1 = (VkPipelineRenderingCreateInfo *)memmove(pVVar1,src,count * 0x28);
      return pVVar1;
    }
  }
  return (VkPipelineRenderingCreateInfo *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}